

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islamcal.cpp
# Opt level: O2

void icu_63::IslamicCalendar::initializeSystemDefaultCentury(void)

{
  UDate millis;
  UErrorCode status;
  Locale local_358;
  IslamicCalendar calendar;
  
  status = U_ZERO_ERROR;
  Locale::Locale(&local_358,"@calendar=islamic-civil",(char *)0x0,(char *)0x0,(char *)0x0);
  IslamicCalendar(&calendar,&local_358,&status,CIVIL);
  Locale::~Locale(&local_358);
  if (status < U_ILLEGAL_ARGUMENT_ERROR) {
    millis = Calendar::getNow();
    Calendar::setTimeInMillis(&calendar.super_Calendar,millis,&status);
    Calendar::add(&calendar.super_Calendar,UCAL_YEAR,-0x50,&status);
    gSystemDefaultCenturyStart = Calendar::getTimeInMillis(&calendar.super_Calendar,&status);
    gSystemDefaultCenturyStartYear = Calendar::get(&calendar.super_Calendar,UCAL_YEAR,&status);
  }
  Calendar::~Calendar(&calendar.super_Calendar);
  return;
}

Assistant:

U_CFUNC void U_CALLCONV
IslamicCalendar::initializeSystemDefaultCentury()
{
    // initialize systemDefaultCentury and systemDefaultCenturyYear based
    // on the current time.  They'll be set to 80 years before
    // the current time.
    UErrorCode status = U_ZERO_ERROR;
    IslamicCalendar calendar(Locale("@calendar=islamic-civil"),status);
    if (U_SUCCESS(status)) {
        calendar.setTime(Calendar::getNow(), status);
        calendar.add(UCAL_YEAR, -80, status);

        gSystemDefaultCenturyStart = calendar.getTime(status);
        gSystemDefaultCenturyStartYear = calendar.get(UCAL_YEAR, status);
    }
    // We have no recourse upon failure unless we want to propagate the failure
    // out.
}